

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool __thiscall google::protobuf::safe_strtob(protobuf *this,StringPiece str,bool *value)

{
  bool bVar1;
  LogMessage *pLVar2;
  undefined1 uVar3;
  StringPiece s1;
  StringPiece s1_00;
  StringPiece s1_01;
  StringPiece s1_02;
  StringPiece s1_03;
  StringPiece s1_04;
  StringPiece s1_05;
  StringPiece s1_06;
  StringPiece s1_07;
  StringPiece s1_08;
  LogMessage local_110;
  StringPiece local_d8;
  StringPiece local_c8;
  StringPiece local_b8;
  StringPiece local_a8;
  StringPiece local_98;
  StringPiece local_88;
  StringPiece local_78;
  StringPiece local_68;
  StringPiece local_58;
  StringPiece local_48;
  LogFinisher local_31;
  
  s1.length_ = str.ptr_;
  if ((undefined1 *)str.length_ == (undefined1 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
               ,0x51f);
    pLVar2 = internal::LogMessage::operator<<(&local_110,"CHECK failed: value != nullptr: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"nullptr output boolean given.");
    internal::LogFinisher::operator=(&local_31,pLVar2);
    internal::LogMessage::~LogMessage(&local_110);
  }
  StringPiece::StringPiece(&local_d8,"true");
  s1.ptr_ = (char *)this;
  bVar1 = CaseEqual(s1,local_d8);
  uVar3 = 1;
  if (!bVar1) {
    StringPiece::StringPiece(&local_c8,"t");
    s1_00.length_ = (stringpiece_ssize_type)s1.length_;
    s1_00.ptr_ = (char *)this;
    bVar1 = CaseEqual(s1_00,local_c8);
    if (!bVar1) {
      StringPiece::StringPiece(&local_b8,"yes");
      s1_01.length_ = (stringpiece_ssize_type)s1.length_;
      s1_01.ptr_ = (char *)this;
      bVar1 = CaseEqual(s1_01,local_b8);
      if (!bVar1) {
        StringPiece::StringPiece(&local_a8,"y");
        s1_02.length_ = (stringpiece_ssize_type)s1.length_;
        s1_02.ptr_ = (char *)this;
        bVar1 = CaseEqual(s1_02,local_a8);
        if (!bVar1) {
          StringPiece::StringPiece(&local_98,"1");
          s1_03.length_ = (stringpiece_ssize_type)s1.length_;
          s1_03.ptr_ = (char *)this;
          bVar1 = CaseEqual(s1_03,local_98);
          if (!bVar1) {
            StringPiece::StringPiece(&local_88,"false");
            s1_04.length_ = (stringpiece_ssize_type)s1.length_;
            s1_04.ptr_ = (char *)this;
            bVar1 = CaseEqual(s1_04,local_88);
            if (!bVar1) {
              StringPiece::StringPiece(&local_78,"f");
              s1_05.length_ = (stringpiece_ssize_type)s1.length_;
              s1_05.ptr_ = (char *)this;
              bVar1 = CaseEqual(s1_05,local_78);
              if (!bVar1) {
                StringPiece::StringPiece(&local_68,"no");
                s1_06.length_ = (stringpiece_ssize_type)s1.length_;
                s1_06.ptr_ = (char *)this;
                bVar1 = CaseEqual(s1_06,local_68);
                if (!bVar1) {
                  StringPiece::StringPiece(&local_58,"n");
                  s1_07.length_ = (stringpiece_ssize_type)s1.length_;
                  s1_07.ptr_ = (char *)this;
                  bVar1 = CaseEqual(s1_07,local_58);
                  if (!bVar1) {
                    StringPiece::StringPiece(&local_48,"0");
                    s1_08.length_ = (stringpiece_ssize_type)s1.length_;
                    s1_08.ptr_ = (char *)this;
                    bVar1 = CaseEqual(s1_08,local_48);
                    uVar3 = 0;
                    if (!bVar1) {
                      return false;
                    }
                    goto LAB_00291eb2;
                  }
                }
              }
            }
            uVar3 = 0;
          }
        }
      }
    }
  }
LAB_00291eb2:
  *(undefined1 *)str.length_ = uVar3;
  return true;
}

Assistant:

bool safe_strtob(StringPiece str, bool* value) {
  GOOGLE_CHECK(value != nullptr) << "nullptr output boolean given.";
  if (CaseEqual(str, "true") || CaseEqual(str, "t") ||
      CaseEqual(str, "yes") || CaseEqual(str, "y") ||
      CaseEqual(str, "1")) {
    *value = true;
    return true;
  }
  if (CaseEqual(str, "false") || CaseEqual(str, "f") ||
      CaseEqual(str, "no") || CaseEqual(str, "n") ||
      CaseEqual(str, "0")) {
    *value = false;
    return true;
  }
  return false;
}